

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall smf::Option_register::~Option_register(Option_register *this)

{
  std::__cxx11::string::~string((string *)&this->m_modifiedOption);
  std::__cxx11::string::~string((string *)&this->m_defaultOption);
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Option_register::~Option_register() {
	// do nothing
}